

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_ThrowOutOfMemory(JSContext *ctx)

{
  JSRuntime *pJVar1;
  JSValue JVar2;
  JSContext *in_RDI;
  JSRuntime *rt;
  uint uStack_c;
  
  pJVar1 = in_RDI->rt;
  if (pJVar1->field_0xf0 == '\0') {
    pJVar1->field_0xf0 = 1;
    JS_ThrowInternalError(in_RDI,"out of memory");
    pJVar1->field_0xf0 = 0;
  }
  JVar2.tag = 6;
  JVar2.u.ptr = (void *)((ulong)uStack_c << 0x20);
  return JVar2;
}

Assistant:

JSValue JS_ThrowOutOfMemory(JSContext *ctx)
{
    JSRuntime *rt = ctx->rt;
    if (!rt->in_out_of_memory) {
        rt->in_out_of_memory = TRUE;
        JS_ThrowInternalError(ctx, "out of memory");
        rt->in_out_of_memory = FALSE;
    }
    return JS_EXCEPTION;
}